

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall Search::predictor::free_ec(predictor *this)

{
  example *in_RDI;
  _func_void_void_ptr *unaff_retaddr;
  size_t i;
  _func_void_void_ptr *in_stack_fffffffffffffff0;
  _func_void_void_ptr *delete_prediction;
  example *ec;
  
  if (((in_RDI->super_example_predict).indices.erase_count & 1) != 0) {
    if (((ulong)(in_RDI->super_example_predict).indices._begin & 1) == 0) {
      VW::dealloc_example(unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
    }
    else {
      ec = in_RDI;
      for (delete_prediction = (_func_void_void_ptr *)0x0;
          delete_prediction < (in_RDI->super_example_predict).indices.end_array;
          delete_prediction = delete_prediction + 1) {
        VW::dealloc_example(unaff_retaddr,ec,delete_prediction);
      }
    }
    free((in_RDI->super_example_predict).indices._end);
  }
  return;
}

Assistant:

void predictor::free_ec()
{
  if (ec_alloced)
  {
    if (is_ldf)
      for (size_t i = 0; i < ec_cnt; i++) VW::dealloc_example(CS::cs_label.delete_label, ec[i]);
    else
      VW::dealloc_example(nullptr, *ec);
    free(ec);
  }
}